

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

int helics::apps::addUsedPotentialInterfaceTemplates
              (json *potentialCommand,
              vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
              *potentials,string *possibleFed,int logLevel,string *type,Federate *fed)

{
  key_type *key;
  value_t vVar1;
  pointer pTVar2;
  json_value jVar3;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar4;
  pointer in_RAX;
  undefined7 extraout_var;
  reference pvVar5;
  pointer extraout_RAX;
  pointer ptVar6;
  pointer extraout_RAX_00;
  pointer extraout_RAX_01;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *__range2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar7;
  pointer pTVar8;
  TemplateMatcher *ifaceTemplate;
  initializer_list_t init;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view fmt;
  string_view message;
  format_args args;
  undefined1 local_108 [32];
  string local_e8;
  string local_c8;
  key_type local_a8;
  undefined1 local_88 [88];
  undefined7 extraout_var_00;
  
  pTVar8 = (potentials->
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (potentials->
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  aVar7 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)fed;
  while( true ) {
    if (pTVar8 == pTVar2) {
      return (int)in_RAX;
    }
    __x._M_len = (pTVar8->federate)._M_len;
    __x._M_str = (pTVar8->federate)._M_str;
    __y._M_str = (possibleFed->_M_dataplus)._M_p;
    __y._M_len = possibleFed->_M_string_length;
    bVar4 = std::operator==(__x,__y);
    in_RAX = (pointer)CONCAT71(extraout_var,bVar4);
    if ((bVar4) &&
       (in_RAX = (pTVar8->usedTemplates).
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       in_RAX != (pTVar8->usedTemplates).
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) break;
    pTVar8 = pTVar8 + 1;
  }
  init._M_len = 0;
  init._M_array = (iterator)(local_108 + 0x10);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::array(init);
  std::__cxx11::string::string
            ((string *)&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type);
  pvVar5 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::operator[](potentialCommand,&local_a8);
  vVar1 = (pvVar5->m_data).m_type;
  (pvVar5->m_data).m_type = local_108[0x10];
  jVar3 = (pvVar5->m_data).m_value;
  (pvVar5->m_data).m_value = (json_value)local_108._24_8_;
  local_108[0x10] = vVar1;
  local_108._24_8_ = jVar3;
  std::__cxx11::string::~string((string *)&local_a8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)(local_108 + 0x10));
  pTVar2 = (potentials->
           super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  key = (key_type *)(local_88 + 0x38);
  ptVar6 = extraout_RAX;
  for (pTVar8 = (potentials->
                super__Vector_base<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                )._M_impl.super__Vector_impl_data._M_start; pTVar8 != pTVar2; pTVar8 = pTVar8 + 1) {
    __x_00._M_len = (pTVar8->federate)._M_len;
    __x_00._M_str = (pTVar8->federate)._M_str;
    __y_00._M_str = (possibleFed->_M_dataplus)._M_p;
    __y_00._M_len = possibleFed->_M_string_length;
    bVar4 = std::operator==(__x_00,__y_00);
    ptVar6 = (pointer)CONCAT71(extraout_var_00,bVar4);
    if ((bVar4) &&
       (ptVar6 = (pTVar8->usedTemplates).
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       ptVar6 != (pTVar8->usedTemplates).
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::string
                ((string *)key,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type);
      pvVar5 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](potentialCommand,key);
      TemplateMatcher::usedInterfaceGeneration_abi_cxx11_((TemplateMatcher *)local_88);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar5,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)local_88);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)local_88);
      std::__cxx11::string::~string((string *)key);
      ptVar6 = extraout_RAX_00;
      if (8 < logLevel) {
        TemplateMatcher::usedInterfaceGeneration_abi_cxx11_((TemplateMatcher *)local_108);
        fileops::generateJsonString(&local_c8,(json *)local_108,true);
        local_88._0_8_ = (possibleFed->_M_dataplus)._M_p;
        local_88._8_8_ = possibleFed->_M_string_length;
        local_88._16_8_ = (type->_M_dataplus)._M_p;
        local_88._24_8_ = type->_M_string_length;
        local_88._32_8_ = local_c8._M_dataplus._M_p;
        local_88._40_8_ = local_c8._M_string_length;
        fmt.size_ = 0xddd;
        fmt.data_ = (char *)0x19;
        args.field_1.args_ = aVar7.args_;
        args.desc_ = (unsigned_long_long)local_88;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)(local_108 + 0x20),(v11 *)"federate {} request {} {}",fmt,args);
        message._M_str = local_e8._M_dataplus._M_p;
        message._M_len = local_e8._M_string_length;
        Federate::logMessage(fed,9,message);
        std::__cxx11::string::~string((string *)(local_108 + 0x20));
        std::__cxx11::string::~string((string *)&local_c8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_108);
        ptVar6 = extraout_RAX_01;
      }
    }
  }
  return (int)ptVar6;
}

Assistant:

static int addUsedPotentialInterfaceTemplates(nlohmann::json& potentialCommand,
                                              std::vector<TemplateMatcher>& potentials,
                                              const std::string& possibleFed,
                                              int logLevel,
                                              const std::string& type,
                                              Federate* fed)
{
    bool hasInterfaceTemplates{false};
    for (auto& ifaceTemplate : potentials) {
        if (ifaceTemplate.federate != possibleFed) {
            continue;
        }
        if (!ifaceTemplate.isUsed()) {
            continue;
        }
        hasInterfaceTemplates = true;
        break;
    }
    if (hasInterfaceTemplates) {
        potentialCommand[type] = nlohmann::json::array();
        for (auto& ifaceTemplate : potentials) {
            if (ifaceTemplate.federate != possibleFed) {
                continue;
            }
            if (!ifaceTemplate.isUsed()) {
                continue;
            }
            potentialCommand[type].push_back(ifaceTemplate.usedInterfaceGeneration());
            if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
                fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                                fmt::format("federate {} request {} {}",
                                            possibleFed,
                                            type,
                                            fileops::generateJsonString(
                                                ifaceTemplate.usedInterfaceGeneration())));
            }
        }
    }
    return 0;
}